

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_private.h
# Opt level: O2

void refreshTimeout(redisAsyncContext *ctx)

{
  timeval *ptVar1;
  _func_void_void_ptr_timeval *UNRECOVERED_JUMPTABLE;
  
  ptVar1 = (ctx->c).timeout;
  if (((ptVar1 != (timeval *)0x0) &&
      (UNRECOVERED_JUMPTABLE = (ctx->ev).scheduleTimer,
      UNRECOVERED_JUMPTABLE != (_func_void_void_ptr_timeval *)0x0)) &&
     (ptVar1->tv_sec != 0 || ptVar1->tv_usec != 0)) {
    (*UNRECOVERED_JUMPTABLE)((ctx->ev).data,*ptVar1);
    return;
  }
  return;
}

Assistant:

static inline void refreshTimeout(redisAsyncContext *ctx) {
    if (ctx->c.timeout && ctx->ev.scheduleTimer &&
        (ctx->c.timeout->tv_sec || ctx->c.timeout->tv_usec)) {
        ctx->ev.scheduleTimer(ctx->ev.data, *ctx->c.timeout);
    // } else {
    //     printf("Not scheduling timer.. (tmo=%p)\n", ctx->c.timeout);
    //     if (ctx->c.timeout){
    //         printf("tv_sec: %u. tv_usec: %u\n", ctx->c.timeout->tv_sec,
    //                ctx->c.timeout->tv_usec);
    //     }
    }
}